

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

Matrix<double,_2,_3,_0,_2,_3> *
projects::ipdg_stokes::mesh::computeOutwardNormals
          (Matrix<double,_2,_3,_0,_2,_3> *__return_storage_ptr__,Entity *entity)

{
  long col;
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  MatrixXd *pMVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> *this;
  ActualDstType actualDst;
  long col_00;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  MatrixXd vertices;
  Matrix<double,_2,_3,_0,_2,_3> test;
  scalar_difference_op<double,_double> local_341;
  Matrix<double,__1,__1,_0,__1,__1> local_340;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_> local_328;
  Matrix<double,_2,_3,_0,_2,_3> local_308;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_2d8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_2a0;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_268;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_230;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_1f8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_1c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_188;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_110;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_98;
  
  iVar2 = (*entity->_vptr_Entity[3])(entity);
  iVar3 = (*entity->_vptr_Entity[4])(entity);
  local_98.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data._0_1_
       = (undefined1)iVar3;
  pMVar4 = lf::base::RefEl::NodeCoords((RefEl *)&local_98);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (&local_340,(long *)CONCAT44(extraout_var,iVar2),pMVar4);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::resize
            (&__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>,
             local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows,local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
  if (1 < local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols) {
    col_00 = 0;
    do {
      col = col_00 + 1;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340
                          ,1,col);
      dVar8 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340
                          ,1,col_00);
      dVar10 = *pSVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                          __return_storage_ptr__,0,col_00);
      *pSVar6 = dVar8 - dVar10;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340
                          ,0,col_00);
      dVar8 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340
                          ,0,col);
      dVar10 = *pSVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                          __return_storage_ptr__,1,col_00);
      *pSVar6 = dVar8 - dVar10;
      col_00 = col;
    } while (col < local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols + -1);
  }
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340,1,0
                     );
  dVar8 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340,1,
                      local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + -1);
  dVar10 = *pSVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                      __return_storage_ptr__,0,
                      local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + -1);
  *pSVar6 = dVar8 - dVar10;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340,0,
                      local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + -1);
  dVar8 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_340,0,0
                     );
  dVar10 = *pSVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_1> *)
                      __return_storage_ptr__,1,
                      local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + -1);
  *pSVar6 = dVar8 - dVar10;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_1c0,&local_340,2);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_1f8,&local_340,0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_98,&local_1c0,&local_1f8,(scalar_difference_op<double,_double> *)&local_110
                 );
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_328,&local_308,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)&local_98);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_230,&local_340,0);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_268,&local_340,1);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_110,&local_230,&local_268,
                  (scalar_difference_op<double,_double> *)&local_188);
  this = Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
                   ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)&local_328,
                    (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     *)&local_110);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_2a0,&local_340,1);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_2d8,&local_340,2);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_188,&local_2a0,&local_2d8,&local_341);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,3,0,2,3>> *)this,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
              *)&local_188);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::finished(&local_328);
  dVar8 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
          m_storage.m_data.array[0];
  dVar10 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
           m_storage.m_data.array[1];
  dVar11 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
           m_storage.m_data.array[2];
  dVar12 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
           m_storage.m_data.array[3];
  dVar13 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
           m_storage.m_data.array[4];
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).
          m_storage.m_data.array[5];
  dVar7 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[1] * dVar10 +
          local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0] * dVar8;
  dVar8 = dVar7 * dVar8;
  dVar7 = dVar7 * dVar10;
  dVar10 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
           array[3] * dVar12 +
           local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
           array[2] * dVar11;
  dVar11 = dVar10 * dVar11;
  dVar10 = dVar10 * dVar12;
  dVar12 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
           array[5] * dVar1 +
           local_308.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
           array[4] * dVar13;
  dVar13 = dVar12 * dVar13;
  dVar12 = dVar12 * dVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7 * dVar7 + dVar8 * dVar8;
  auVar15 = sqrtpd(auVar14,auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar10 * dVar10 + dVar11 * dVar11;
  auVar18 = sqrtpd(auVar17,auVar17);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar12 * dVar12 + dVar13 * dVar13;
  auVar14 = sqrtpd(auVar20,auVar20);
  auVar9._0_8_ = -dVar8;
  auVar9._8_8_ = -dVar7;
  auVar16._0_8_ = auVar15._0_8_;
  auVar16._8_8_ = auVar16._0_8_;
  auVar9 = divpd(auVar9,auVar16);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).m_storage.
   m_data.array = auVar9;
  auVar15._0_8_ = -dVar11;
  auVar15._8_8_ = -dVar10;
  auVar19._0_8_ = auVar18._0_8_;
  auVar19._8_8_ = auVar19._0_8_;
  auVar9 = divpd(auVar15,auVar19);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).m_storage
    .m_data.array + 2) = auVar9;
  auVar18._0_8_ = -dVar13;
  auVar18._8_8_ = -dVar12;
  auVar21._0_8_ = auVar14._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  auVar9 = divpd(auVar18,auVar21);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>).m_storage
    .m_data.array + 4) = auVar9;
  free(local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 2, 3> computeOutwardNormals(
    const lf::mesh::Entity &entity) {
  // Get the geometry of the entity
  const auto *const geom = entity.Geometry();
  // Compute the global vertex coordinates
  Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  Eigen::Matrix<double, 2, 3> normals(vertices.rows(), vertices.cols());
  for (long vert = 0; vert < vertices.cols() - 1; ++vert) {
    normals(0, vert) = vertices(1, vert + 1) - vertices(1, vert + 0);
    normals(1, vert) = vertices(0, vert + 0) - vertices(0, vert + 1);
  }
  normals(0, vertices.cols() - 1) =
      vertices(1, 0) - vertices(1, vertices.cols() - 1);
  normals(1, vertices.cols() - 1) =
      vertices(0, vertices.cols() - 1) - vertices(0, 0);
  // Compute test vectors to test whether the normal faces inward or outward
  Eigen::Matrix<double, 2, 3> test;
  test << vertices.col(2) - vertices.col(0), vertices.col(0) - vertices.col(1),
      vertices.col(1) - vertices.col(2);
  // Compute the sign to flip the normals
  Eigen::Matrix<double, 1, 3> flip =
      (normals.array() * test.array()).matrix().colwise().sum();
  normals.array().row(0) *= flip.array();
  normals.array().row(1) *= flip.array();
  normals = -normals.colwise().normalized();
  return normals;
}